

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<int,duckdb::string_t,duckdb::UnaryOperatorWrapper,duckdb::ChrOperator>
               (int *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  anon_struct_16_2_cfc5f80c_for_inlined *paVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char **ppcVar12;
  string_t sVar13;
  int local_6c;
  int local_68;
  int local_64;
  char *local_60;
  ValidityMask *local_58;
  idx_t local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar12 = &(result_data->value).pointer.ptr;
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      local_64 = ldata[iVar7];
      sVar13 = ChrOperator::Operation<int,duckdb::string_t>(&local_64);
      uVar5 = sVar13.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar12 + -1);
      paVar1->length = (int)uVar5;
      paVar1->prefix[0] = (char)((ulong)uVar5 >> 0x20);
      paVar1->prefix[1] = (char)((ulong)uVar5 >> 0x28);
      paVar1->prefix[2] = (char)((ulong)uVar5 >> 0x30);
      paVar1->prefix[3] = (char)((ulong)uVar5 >> 0x38);
      *ppcVar12 = sVar13.value._8_8_;
      ppcVar12 = ppcVar12 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    local_48 = count + 0x3f >> 6;
    local_60 = (result_data->value).inlined.inlined + 4;
    uVar8 = 0;
    local_58 = mask;
    local_50 = count;
    for (local_40 = 0; local_40 != local_48; local_40 = local_40 + 1) {
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_01d988fa:
        pcVar11 = local_60 + uVar8 * 0x10;
        for (; uVar6 = uVar8, uVar8 < uVar9; uVar8 = uVar8 + 1) {
          local_6c = ldata[uVar8];
          sVar13 = ChrOperator::Operation<int,duckdb::string_t>(&local_6c);
          uVar5 = sVar13.value._0_8_;
          paVar2 = (anon_struct_16_2_cfc5f80c_for_inlined *)(pcVar11 + -8);
          paVar2->length = (int)uVar5;
          paVar2->inlined[0] = (char)((ulong)uVar5 >> 0x20);
          paVar2->inlined[1] = (char)((ulong)uVar5 >> 0x28);
          paVar2->inlined[2] = (char)((ulong)uVar5 >> 0x30);
          paVar2->inlined[3] = (char)((ulong)uVar5 >> 0x38);
          *(long *)pcVar11 = sVar13.value._8_8_;
          pcVar11 = pcVar11 + 0x10;
        }
      }
      else {
        uVar4 = puVar3[local_40];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_01d988fa;
        uVar6 = uVar9;
        if (uVar4 != 0) {
          local_38 = ldata + uVar8;
          pcVar11 = local_60 + uVar8 * 0x10;
          for (uVar10 = 0; uVar6 = uVar8 + uVar10, mask = local_58, count = local_50,
              uVar8 + uVar10 < uVar9; uVar10 = uVar10 + 1) {
            if ((uVar4 >> (uVar10 & 0x3f) & 1) != 0) {
              local_68 = local_38[uVar10];
              sVar13 = ChrOperator::Operation<int,duckdb::string_t>(&local_68);
              uVar5 = sVar13.value._0_8_;
              paVar2 = (anon_struct_16_2_cfc5f80c_for_inlined *)(pcVar11 + -8);
              paVar2->length = (int)uVar5;
              paVar2->inlined[0] = (char)((ulong)uVar5 >> 0x20);
              paVar2->inlined[1] = (char)((ulong)uVar5 >> 0x28);
              paVar2->inlined[2] = (char)((ulong)uVar5 >> 0x30);
              paVar2->inlined[3] = (char)((ulong)uVar5 >> 0x38);
              *(long *)pcVar11 = sVar13.value._8_8_;
            }
            pcVar11 = pcVar11 + 0x10;
          }
        }
      }
      uVar8 = uVar6;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}